

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# history.c
# Opt level: O0

int history_def_enter(void *p,HistEvent *ev,char *str)

{
  bool bVar1;
  int iVar2;
  history_t *h;
  char *str_local;
  HistEvent *ev_local;
  void *p_local;
  
  if ((((*(uint *)((long)p + 0x3c) & 1) == 0) || (*(void **)((long)p + 0x18) == p)) ||
     (iVar2 = strcmp(*(char **)(*(long *)((long)p + 0x18) + 8),str), iVar2 != 0)) {
    iVar2 = history_def_insert((history_t *)p,ev,str);
    if (iVar2 == -1) {
      p_local._4_4_ = -1;
    }
    else {
      while( true ) {
        bVar1 = false;
        if (*(int *)((long)p + 0x30) < *(int *)((long)p + 0x34)) {
          bVar1 = 0 < *(int *)((long)p + 0x34);
        }
        if (!bVar1) break;
        history_def_delete((history_t *)p,ev,*(hentry_t_conflict **)((long)p + 0x20));
      }
      p_local._4_4_ = 1;
    }
  }
  else {
    p_local._4_4_ = 0;
  }
  return p_local._4_4_;
}

Assistant:

static int
history_def_enter(void *p, TYPE(HistEvent) *ev, const Char *str)
{
	history_t *h = (history_t *) p;

	if ((h->flags & H_UNIQUE) != 0 && h->list.next != &h->list &&
	    Strcmp(h->list.next->ev.str, str) == 0)
	    return 0;

	if (history_def_insert(h, ev, str) == -1)
		return -1;	/* error, keep error message */

	/*
         * Always keep at least one entry.
         * This way we don't have to check for the empty list.
         */
	while (h->cur > h->max && h->cur > 0)
		history_def_delete(h, ev, h->list.prev);

	return 1;
}